

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_ObjZ(FParser *this)

{
  AActor *pAVar1;
  int iVar2;
  
  if (this->t_argc == 0) {
    pAVar1 = (this->Script->trigger).field_0.p;
    iVar2 = 0;
    if (pAVar1 == (AActor *)0x0) goto LAB_005065fa;
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->Script->trigger).field_0.p = (AActor *)0x0;
      goto LAB_005065fa;
    }
  }
  else {
    pAVar1 = actorvalue(this->t_argv);
    if (pAVar1 == (AActor *)0x0) {
      iVar2 = 0;
      goto LAB_005065fa;
    }
  }
  iVar2 = (int)((pAVar1->__Pos).Z * 65536.0);
LAB_005065fa:
  (this->t_return).value.i = iVar2;
  (this->t_return).type = 6;
  return;
}

Assistant:

void FParser::SF_ObjZ(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;	
	}

	t_return.setDouble(mo ? mo->Z() : 0.);
}